

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multipart_test.cc
# Opt level: O0

void __thiscall
IntegrationTest_TestMultipartUpload_emptyfile_Test::TestBody
          (IntegrationTest_TestMultipartUpload_emptyfile_Test *this)

{
  char **self;
  bool bVar1;
  uint uVar2;
  char *pcVar3;
  Qiniu_Error QVar4;
  AssertHelper local_1250;
  Message local_1248;
  int local_123c;
  undefined1 local_1238 [8];
  AssertionResult gtest_ar_3;
  AssertHelper local_1218;
  Message local_1210;
  undefined1 local_1208 [8];
  AssertionResult gtest_ar_2;
  Message local_11f0;
  int local_11e4;
  undefined1 local_11e0 [8];
  AssertionResult gtest_ar_1;
  Message local_11c8 [3];
  int local_11ac;
  undefined1 local_11a8 [8];
  AssertionResult gtest_ar;
  undefined1 local_1188 [8];
  Qiniu_RS_StatRet statResult;
  char *returnKey;
  char filePath [4096];
  char local_148 [8];
  char inputKey [100];
  undefined1 local_d8 [8];
  Qiniu_Mac mac;
  Qiniu_Error err;
  Qiniu_Client client;
  IntegrationTest_TestMultipartUpload_emptyfile_Test *this_local;
  
  err.message = (char *)0x0;
  local_d8 = (undefined1  [8])QINIU_ACCESS_KEY;
  mac.accessKey = QINIU_SECRET_KEY;
  self = &err.message;
  Qiniu_Client_InitMacAuth((Qiniu_Client *)self,0x400,(Qiniu_Mac *)local_d8);
  Qiniu_Client_SetTimeout((Qiniu_Client *)self,5000);
  Qiniu_Client_SetConnectTimeout((Qiniu_Client *)self,3000);
  Qiniu_Client_EnableAutoQuery((Qiniu_Client *)self,1);
  uVar2 = rand();
  snprintf(local_148,100,"emptyfile_%d",(ulong)uVar2);
  QVar4 = Qiniu_RS_Delete((Qiniu_Client *)self,Test_bucket,local_148);
  filePath._4088_4_ = QVar4.code;
  memset(&returnKey,0,0x1000);
  strcpy((char *)&returnKey,"/workspace/llm4binary/github/license_c_cmakelists/qiniu[P]c-sdk");
  strcat((char *)&returnKey,"/gtests/resources/test_emptyfile.txt");
  statResult.type =
       (Qiniu_Int64)
       putFile_multipart(Test_bucket,local_148,"txt",(char *)&returnKey,0x400000,
                         (Qiniu_Mac *)local_d8);
  QVar4 = Qiniu_RS_Stat((Qiniu_Client *)self,(Qiniu_RS_StatRet *)local_1188,Test_bucket,
                        (char *)statResult.type);
  err._0_8_ = QVar4.message;
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_4_ = QVar4.code;
  mac.secretKey =
       (char *)CONCAT44(gtest_ar.message_._M_t.
                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                        ._M_head_impl._4_4_,
                        (int)gtest_ar.message_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl);
  local_11ac = 200;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_11a8,"err.code","200",(int *)&mac.secretKey,&local_11ac);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_11a8);
  if (!bVar1) {
    testing::Message::Message(local_11c8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_11a8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/qiniu[P]c-sdk/gtests/multipart_test.cc"
               ,0xdd,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,local_11c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(local_11c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_11a8);
  local_11e4 = 0;
  testing::internal::EqHelper::Compare<long_long,_int,_nullptr>
            ((EqHelper *)local_11e0,"statResult.fsize","0",(longlong *)&statResult.mimeType,
             &local_11e4);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_11e0);
  if (!bVar1) {
    testing::Message::Message(&local_11f0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_11e0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/qiniu[P]c-sdk/gtests/multipart_test.cc"
               ,0xde,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_11f0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_11f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_11e0);
  testing::internal::CmpHelperSTREQ
            ((internal *)local_1208,"statResult.mimeType","\"txt\"",statResult.hash,"txt");
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1208);
  if (!bVar1) {
    testing::Message::Message(&local_1210);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1208);
    testing::internal::AssertHelper::AssertHelper
              (&local_1218,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/qiniu[P]c-sdk/gtests/multipart_test.cc"
               ,0xdf,pcVar3);
    testing::internal::AssertHelper::operator=(&local_1218,&local_1210);
    testing::internal::AssertHelper::~AssertHelper(&local_1218);
    testing::Message::~Message(&local_1210);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1208);
  QVar4 = Qiniu_RS_Delete((Qiniu_Client *)&err.message,Test_bucket,(char *)statResult.type);
  err._0_8_ = QVar4.message;
  gtest_ar_3.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_4_ = QVar4.code;
  mac.secretKey =
       (char *)CONCAT44(gtest_ar_3.message_._M_t.
                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                        ._M_head_impl._4_4_,
                        (int)gtest_ar_3.message_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl);
  local_123c = 200;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_1238,"err.code","200",(int *)&mac.secretKey,&local_123c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1238);
  if (!bVar1) {
    testing::Message::Message(&local_1248);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1238);
    testing::internal::AssertHelper::AssertHelper
              (&local_1250,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/qiniu[P]c-sdk/gtests/multipart_test.cc"
               ,0xe3,pcVar3);
    testing::internal::AssertHelper::operator=(&local_1250,&local_1248);
    testing::internal::AssertHelper::~AssertHelper(&local_1250);
    testing::Message::~Message(&local_1248);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1238);
  Qiniu_Client_Cleanup((Qiniu_Client *)&err.message);
  return;
}

Assistant:

TEST(IntegrationTest, TestMultipartUpload_emptyfile)
{
	Qiniu_Client client;
	Qiniu_Zero(client);

	Qiniu_Error err;
	Qiniu_Mac mac = {QINIU_ACCESS_KEY, QINIU_SECRET_KEY};
	Qiniu_Client_InitMacAuth(&client, 1024, &mac);
	Qiniu_Client_SetTimeout(&client, 5000);
	Qiniu_Client_SetConnectTimeout(&client, 3000);
	Qiniu_Client_EnableAutoQuery(&client, Qiniu_True);

	char inputKey[100];
	Qiniu_snprintf(inputKey, 100, "emptyfile_%d", rand());

	// step1: delete  file if exist
	Qiniu_RS_Delete(&client, Test_bucket, inputKey);

	// step2: upload file
	char filePath[PATH_MAX] = {0};
	strcpy(filePath, __SOURCE_DIR__);
	strcat(filePath, "/gtests/resources/test_emptyfile.txt");
	const char *returnKey = putFile_multipart(Test_bucket, inputKey, "txt", filePath, (4 << 20), &mac);

	// step3: stat file
	Qiniu_RS_StatRet statResult;
	err = Qiniu_RS_Stat(&client, &statResult, Test_bucket, returnKey);
	EXPECT_EQ(err.code, 200);
	EXPECT_EQ(statResult.fsize, 0);
	EXPECT_STREQ(statResult.mimeType, "txt");

	// step4: delete file
	err = Qiniu_RS_Delete(&client, Test_bucket, returnKey);
	EXPECT_EQ(err.code, 200);

	Qiniu_Client_Cleanup(&client);
}